

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldOptions *pFVar4;
  MessageOptions *pMVar5;
  MessageOptions *pMVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  if (((this->pool_->lazily_build_dependencies_ & 1U) == 0) ||
     ((field != (FieldDescriptor *)0x0 &&
      (pDVar3 = FieldDescriptor::message_type(field), pDVar3 != (Descriptor *)0x0)))) {
    pFVar4 = FieldDescriptor::options(field);
    bVar1 = FieldOptions::lazy(pFVar4);
    if ((bVar1) && (TVar2 = FieldDescriptor::type(field), TVar2 != TYPE_MESSAGE)) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddError(this,psVar8,&proto->super_Message,TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
    pFVar4 = FieldDescriptor::options(field);
    bVar1 = FieldOptions::packed(pFVar4);
    if ((bVar1) && (bVar1 = FieldDescriptor::is_packable(field), !bVar1)) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddError(this,psVar8,&proto->super_Message,TYPE,
               "[packed = true] can only be specified for repeated primitive fields.");
    }
    if (*(long *)(field + 0x58) != 0) {
      pDVar3 = FieldDescriptor::containing_type(field);
      pMVar5 = Descriptor::options(pDVar3);
      pMVar6 = MessageOptions::default_instance();
      if (pMVar5 != pMVar6) {
        pDVar3 = FieldDescriptor::containing_type(field);
        pMVar5 = Descriptor::options(pDVar3);
        bVar1 = MessageOptions::message_set_wire_format(pMVar5);
        if (bVar1) {
          bVar1 = FieldDescriptor::is_extension(field);
          if (bVar1) {
            bVar1 = FieldDescriptor::is_optional(field);
            if ((!bVar1) || (TVar2 = FieldDescriptor::type(field), TVar2 != TYPE_MESSAGE)) {
              psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
              AddError(this,psVar8,&proto->super_Message,TYPE,
                       "Extensions of MessageSets must be optional messages.");
            }
          }
          else {
            psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
            AddError(this,psVar8,&proto->super_Message,NAME,
                     "MessageSets cannot have fields, only extensions.");
          }
        }
      }
    }
    pFVar7 = FieldDescriptor::file(field);
    bVar1 = IsLite(pFVar7);
    if ((bVar1) && (*(long *)(field + 0x58) != 0)) {
      pDVar3 = FieldDescriptor::containing_type(field);
      pFVar7 = Descriptor::file(pDVar3);
      bVar1 = IsLite(pFVar7);
      if (!bVar1) {
        psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
        AddError(this,psVar8,&proto->super_Message,EXTENDEE,
                 "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
                );
      }
    }
    bVar1 = FieldDescriptor::is_map(field);
    if ((bVar1) && (bVar1 = ValidateMapEntry(this,field,proto), !bVar1)) {
      psVar8 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddError(this,psVar8,&proto->super_Message,OTHER,
               "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(FieldDescriptor* field,
    const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
      field->full_name(), proto,
      DescriptorPool::ErrorCollector::TYPE,
      "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != NULL &&
      &field->containing_type()->options() !=
      &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) &&
      field->containing_type_ != NULL &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

}